

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DynamicTypeHandler::SetPropertyUpdateSideEffect
          (DynamicTypeHandler *this,DynamicObject *instance,CharacterBuffer<char16_t> *propertyName,
          Var value,SideEffects possibleSideEffects)

{
  ScriptContext *this_00;
  char16_t *pcVar1;
  bool bVar2;
  int iVar3;
  SideEffects se;
  undefined3 in_register_00000081;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  if (CONCAT31(in_register_00000081,possibleSideEffects) == 0) {
    return;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  if ((propertyName->len == 7) &&
     ((pcVar1 = (propertyName->string).ptr,
      pcVar1 == (char16_t *)(BuiltInPropertyRecords::valueOf + 0x18) ||
      (iVar3 = PAL_wmemcmp((char16_t *)(BuiltInPropertyRecords::valueOf + 0x18),pcVar1,7),
      iVar3 == 0)))) {
    se = possibleSideEffects & SideEffects_ValueOf;
  }
  else {
    if ((propertyName->len != 8) ||
       ((pcVar1 = (propertyName->string).ptr,
        pcVar1 != (char16_t *)(BuiltInPropertyRecords::toString + 0x18) &&
        (iVar3 = PAL_wmemcmp((char16_t *)(BuiltInPropertyRecords::toString + 0x18),pcVar1,8),
        iVar3 != 0)))) {
      if ((propertyName->len == 4) &&
         ((pcVar1 = (propertyName->string).ptr,
          pcVar1 == (char16_t *)(BuiltInPropertyRecords::Math + 0x18) ||
          (iVar3 = PAL_wmemcmp((char16_t *)(BuiltInPropertyRecords::Math + 0x18),pcVar1,4),
          iVar3 == 0)))) {
        if ((((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            globalObject.ptr == (GlobalObject *)instance) {
          se = possibleSideEffects & SideEffects_MathFunc;
          goto LAB_00e61218;
        }
      }
      else if (((((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
                ).mathObject.ptr == instance) &&
              ((ScriptContext::FindPropertyRecord
                          (this_00,(propertyName->string).ptr,propertyName->len,&local_30),
               local_30 != (PropertyRecord *)0x0 && (bVar2 = IsMathLibraryId(local_30->pid), bVar2))
              )) {
        ScriptContextOptimizationOverrideInfo::SetSideEffects
                  (&this_00->optimizationOverrides,possibleSideEffects & SideEffects_MathFunc);
      }
      return;
    }
    se = possibleSideEffects & SideEffects_ToString;
  }
LAB_00e61218:
  ScriptContextOptimizationOverrideInfo::SetSideEffects(&this_00->optimizationOverrides,se);
  return;
}

Assistant:

void DynamicTypeHandler::SetPropertyUpdateSideEffect(DynamicObject* instance, JsUtil::CharacterBuffer<WCHAR> const& propertyName, Var value, SideEffects possibleSideEffects)
    {
        if (possibleSideEffects)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            if (BuiltInPropertyRecords::valueOf.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ValueOf & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::toString.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_ToString & possibleSideEffects));
            }
            else if (BuiltInPropertyRecords::Math.Equals(propertyName.GetBuffer(), propertyName.GetLength()))
            {
                if (instance == scriptContext->GetLibrary()->GetGlobalObject())
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }
            else if (instance == scriptContext->GetLibrary()->GetMathObject())
            {
                PropertyRecord const* propertyRecord;
                scriptContext->FindPropertyRecord(propertyName.GetBuffer(), propertyName.GetLength(), &propertyRecord);

                if (propertyRecord && IsMathLibraryId(propertyRecord->GetPropertyId()))
                {
                    scriptContext->optimizationOverrides.SetSideEffects((SideEffects)(SideEffects_MathFunc & possibleSideEffects));
                }
            }

        }
    }